

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

LocalSet * __thiscall MixedArena::alloc<wasm::LocalSet>(MixedArena *this)

{
  LocalSet *pLVar1;
  
  pLVar1 = (LocalSet *)allocSpace(this,0x20,8);
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
  (pLVar1->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
  return pLVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }